

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  string local_80;
  string local_60;
  string local_40;
  
  bVar2 = Value::hasComment(root,commentAfterOnSameLine);
  if (bVar2) {
    poVar1 = this->document_;
    Value::getComment_abi_cxx11_(&local_40,root,commentAfterOnSameLine);
    normalizeEOL(&local_60,&local_40);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x17930b);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_80.field_2._M_allocated_capacity = *psVar4;
      local_80.field_2._8_8_ = plVar3[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar4;
      local_80._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_80._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = Value::hasComment(root,commentAfter);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(this->document_,anon_var_dwarf_b832f + 8,1);
    poVar1 = this->document_;
    Value::getComment_abi_cxx11_(&local_60,root,commentAfter);
    normalizeEOL(&local_80,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->document_,anon_var_dwarf_b832f + 8,1);
  }
  return;
}

Assistant:

void 
StyledStreamWriter::writeCommentAfterValueOnSameLine( const Value &root )
{
   if ( root.hasComment( commentAfterOnSameLine ) )
      *document_ << " " + normalizeEOL( root.getComment( commentAfterOnSameLine ) );

   if ( root.hasComment( commentAfter ) )
   {
      *document_ << "\n";
      *document_ << normalizeEOL( root.getComment( commentAfter ) );
      *document_ << "\n";
   }
}